

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> * __thiscall
djb::brdf::eval_batch
          (vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>
           *__return_storage_ptr__,brdf *this,
          vector<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
          *io,void *user_args)

{
  pointer ppVar1;
  int i;
  long lVar2;
  long lVar3;
  long lVar4;
  valarray<float> local_40;
  
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::vector
            (__return_storage_ptr__,
             ((long)(io->
                    super__Vector_base<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(io->
                   super__Vector_base<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)&local_40);
  lVar3 = 0xc;
  lVar4 = 0;
  lVar2 = 0;
  while( true ) {
    ppVar1 = (io->
             super__Vector_base<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(io->
                     super__Vector_base<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1) / 0x18) <= lVar2)
    break;
    (**this->_vptr_brdf)
              (&local_40,this,(long)ppVar1 + lVar3 + -0xc,(long)&(ppVar1->first).x + lVar3,user_args
              );
    std::valarray<float>::operator=
              ((valarray<float> *)
               ((long)&((__return_storage_ptr__->
                        super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->_M_size + lVar4),&local_40);
    operator_delete(local_40._M_data);
    lVar2 = lVar2 + 1;
    lVar3 = lVar3 + 0x18;
    lVar4 = lVar4 + 0x10;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<brdf::value_type>
brdf::eval_batch(
	const std::vector<brdf::io_pair> &io,
	const void *user_args
) const {
	std::vector<brdf::value_type> fr(io.size());

	for (int i = 0; i < (int)io.size(); ++i) {
		fr[i] = eval(io[i].first, io[i].second, user_args);
	}

	return fr;
}